

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

void Am_Get_Sel_Or_Param_In_Display_Order
               (Am_Object *selection_widget,Am_Value_List *selected_objs,Am_Object *group,
               Am_Value *new_sel)

{
  bool bVar1;
  Am_Value *in_value;
  ostream *poVar2;
  Am_Value_List l;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List local_50;
  Am_Value_List local_40;
  Am_Value_List local_30;
  
  bVar1 = Am_Value::Valid(new_sel);
  if (bVar1) {
    in_value = Am_Object::Get(selection_widget,0x193,0);
    Am_Object::operator=(group,in_value);
    if (new_sel->type == 0xa001) {
      Am_Value_List::Make_Empty(selected_objs);
      Am_Value_List::Add(selected_objs,new_sel,Am_TAIL,true);
      return;
    }
    bVar1 = Am_Value_List::Test(new_sel);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar2 = std::operator<<(poVar2,"Specified new value for repeat is not object or list: ");
      poVar2 = operator<<(poVar2,new_sel);
      std::endl<char,std::char_traits<char>>(poVar2);
      Am_Error();
    }
    Am_Value_List::Am_Value_List(&local_30,new_sel);
    Am_Value_List::Am_Value_List(&local_50,&local_30);
    Am_Object::Am_Object(&local_60,group);
    Am_Sort_Obs_In_Group(&local_40,(Am_Object *)&local_50);
    Am_Value_List::operator=(selected_objs,&local_40);
    Am_Value_List::~Am_Value_List(&local_40);
    Am_Object::~Am_Object(&local_60);
    Am_Value_List::~Am_Value_List(&local_50);
    Am_Value_List::~Am_Value_List(&local_30);
  }
  else {
    Am_Object::Am_Object(&local_58,selection_widget);
    Am_Get_Selection_In_Display_Order(&local_58,selected_objs,group);
    Am_Object::~Am_Object(&local_58);
  }
  return;
}

Assistant:

void
Am_Get_Sel_Or_Param_In_Display_Order(Am_Object selection_widget,
                                     Am_Value_List &selected_objs,
                                     Am_Object &group, Am_Value new_sel)
{
  if (new_sel.Valid()) {
    group = selection_widget.Get(Am_OPERATES_ON);
    if (new_sel.type == Am_OBJECT) {
      selected_objs.Make_Empty();
      selected_objs.Add(new_sel);
    } else if (Am_Value_List::Test(new_sel)) {
      Am_Value_List l = new_sel;
      selected_objs = Am_Sort_Obs_In_Group(l, group);
    } else
      Am_ERROR(
          "Specified new value for repeat is not object or list: " << new_sel);
  } else
    Am_Get_Selection_In_Display_Order(selection_widget, selected_objs, group);
}